

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMBICState.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::COMBICState::COMBICState(COMBICState *this)

{
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__COMBICState_00226870;
  this->m_ui32TSC = 0;
  EntityType::EntityType(&this->m_MunSrc);
  this->m_f32BarrageRate = 0.0;
  this->m_f32BarrageDuration = 0.0;
  this->m_f32BarrageCrosswindLength = 0.0;
  this->m_f32BarrageDownwindLength = 0.0;
  this->m_ui32NumSrcs = 0;
  this->m_ui16GeometryIndex = 0;
  this->m_ui16Padding = 0;
  this->m_ui32SrcType = 0;
  this->m_f32BarrageRate = 0.0;
  EulerAngles::EulerAngles(&this->m_DetVel);
  this->m_ui32Padding = 0;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x100;
  (this->super_EnvironmentRecord).m_ui16Length = 0x200;
  return;
}

Assistant:

COMBICState::COMBICState() :
    m_ui32TSC( 0 ),
    m_ui32NumSrcs( 0 ),
    m_ui16GeometryIndex( 0 ),
    m_ui16Padding( 0 ),
    m_ui32SrcType( 0 ),
    m_f32BarrageRate( 0 ),
    m_f32BarrageDuration( 0 ),
    m_f32BarrageCrosswindLength( 0 ),
    m_f32BarrageDownwindLength( 0 ),
    m_ui32Padding( 0 )
{
    m_ui32EnvRecTyp = COMBICStateType;
    m_ui16Length = COMBIC_STATE_SIZE * 8;
}